

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  string local_88;
  text local_68;
  bool local_41;
  result local_40;
  expression_lhs *local_18;
  expression_lhs<const_bool_&> *this_local;
  
  local_41 = (bool)(**(byte **)this & 1);
  local_18 = this;
  this_local = (expression_lhs<const_bool_&> *)__return_storage_ptr__;
  to_string<bool>(&local_88,*(bool **)this);
  std::__cxx11::string::string((string *)&local_68,(string *)&local_88);
  result::result<bool>(&local_40,&local_41,&local_68);
  result::result(__return_storage_ptr__,&local_40);
  result::~result(&local_40);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result( !!lhs, to_string( lhs ) ); }